

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_dehexify.c
# Opt level: O0

void * x11_dehexify(ptrlen hexpl,int *outlen)

{
  int iVar1;
  undefined4 local_38;
  undefined1 local_33;
  undefined1 local_32;
  undefined1 local_31;
  uint val;
  char bytestr [3];
  uchar *ret;
  int i;
  int len;
  int *outlen_local;
  ptrlen hexpl_local;
  
  iVar1 = (int)(hexpl.len >> 1);
  _val = safemalloc((long)iVar1,1,0);
  for (ret._0_4_ = 0; (int)ret < iVar1; ret._0_4_ = (int)ret + 1) {
    local_38 = 0;
    local_33 = *(undefined1 *)((long)hexpl.ptr + (long)((int)ret << 1));
    local_32 = *(undefined1 *)((long)hexpl.ptr + (long)((int)ret * 2 + 1));
    local_31 = 0;
    __isoc99_sscanf(&local_33,"%x",&local_38);
    *(char *)((long)_val + (long)(int)ret) = (char)local_38;
  }
  *outlen = iVar1;
  return _val;
}

Assistant:

void *x11_dehexify(ptrlen hexpl, int *outlen)
{
    int len, i;
    unsigned char *ret;

    len = hexpl.len / 2;
    ret = snewn(len, unsigned char);

    for (i = 0; i < len; i++) {
        char bytestr[3];
        unsigned val = 0;
        bytestr[0] = ((const char *)hexpl.ptr)[2*i];
        bytestr[1] = ((const char *)hexpl.ptr)[2*i+1];
        bytestr[2] = '\0';
        sscanf(bytestr, "%x", &val);
        ret[i] = val;
    }

    *outlen = len;
    return ret;
}